

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

long __thiscall minja::Value::get<long>(Value *this)

{
  runtime_error *this_00;
  long ret;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((((this->array_).
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) &&
      ((this->object_).
       super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr == (element_type *)0x0)) &&
     ((this->callable_).
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    local_38._M_dataplus._M_p = (pointer)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_long,_0>
              (&this->primitive_,(long *)&local_38);
    return (long)local_38._M_dataplus._M_p;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  dump_abi_cxx11_(&sStack_58,this,-1,false);
  std::operator+(&local_38,"get<T> not defined for this value type: ",&sStack_58);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get() const {
    if (is_primitive()) return primitive_.get<T>();
    throw std::runtime_error("get<T> not defined for this value type: " + dump());
  }